

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

interval_t __thiscall
duckdb::Interpolator<true>::
Operation<duckdb::interval_t,duckdb::interval_t,duckdb::QuantileDirect<duckdb::interval_t>>
          (Interpolator<true> *this,interval_t *v_t,Vector *result,
          QuantileDirect<duckdb::interval_t> *accessor)

{
  bool bVar1;
  InvalidInputException *this_00;
  int64_t iVar2;
  RESULT_TYPE input;
  interval_t input_00;
  interval_t result_1;
  interval_t local_50;
  string local_40;
  
  input = InterpolateInternal<duckdb::interval_t,duckdb::QuantileDirect<duckdb::interval_t>>
                    (this,v_t,accessor);
  input_00._0_8_ = input.micros;
  iVar2 = 0;
  bVar1 = TryCast::Operation<duckdb::interval_t,duckdb::interval_t>(input,&local_50,false);
  if (bVar1) {
    return local_50;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  input_00.micros = iVar2;
  CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_40,input._0_8_,input_00);
  InvalidInputException::InvalidInputException(this_00,&local_40);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(InterpolateInternal(v_t, accessor), result);
	}